

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall presolve::HPresolve::scaleMIP(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  pointer piVar1;
  HighsLp *pHVar2;
  int iVar3;
  double *pdVar4;
  size_t j;
  long lVar5;
  HighsInt i;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  for (lVar6 = 0; pHVar2 = this->model, lVar6 < pHVar2->num_row_; lVar6 = lVar6 + 1) {
    if ((((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar6] == '\0') &&
        (iVar3 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6], 0 < iVar3)) &&
       ((this->rowsizeImplInt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6] +
        (this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6] != iVar3)) {
      storeRow(this,(HighsInt)lVar6);
      piVar1 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar8 = 0.0;
      for (lVar5 = 0;
          (long)(this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1 >> 2 != lVar5; lVar5 = lVar5 + 1) {
        iVar3 = piVar1[lVar5];
        if ((this->model->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start
            [(this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar3]] == kContinuous) {
          dVar9 = ABS((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar3]);
          if (dVar8 <= dVar9) {
            dVar8 = dVar9;
          }
        }
      }
      dVar8 = log2(dVar8);
      dVar8 = round(-dVar8);
      dVar8 = exp2(dVar8);
      if ((dVar8 != 1.0) || (NAN(dVar8))) {
        uVar7 = -(ulong)(INFINITY <=
                        (this->model->row_upper_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar6]);
        scaleStoredRow(this,(HighsInt)lVar6,(double)(~uVar7 & (ulong)dVar8 | (ulong)-dVar8 & uVar7),
                       false);
      }
    }
  }
  for (lVar6 = 0; lVar6 < pHVar2->num_col_; lVar6 = lVar6 + 1) {
    if ((((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar6] == '\0') &&
        (0 < (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar6])) &&
       ((pHVar2->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar6] == kContinuous)) {
      lVar5 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6];
      pdVar4 = (double *)0x0;
      if (lVar5 != -1) {
        pdVar4 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar5;
      }
      dVar8 = 0.0;
      while (iVar3 = (int)lVar5, iVar3 != -1) {
        if (dVar8 <= ABS(*pdVar4)) {
          dVar8 = ABS(*pdVar4);
        }
        lVar5 = (long)(this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar3];
        pdVar4 = pdVar4 + (lVar5 - iVar3);
      }
      dVar8 = log2(dVar8);
      dVar8 = round(-dVar8);
      dVar8 = exp2(dVar8);
      if ((dVar8 != 1.0) || (NAN(dVar8))) {
        transformColumn(this,postsolve_stack,(HighsInt)lVar6,dVar8,0.0);
      }
    }
    pHVar2 = this->model;
  }
  return;
}

Assistant:

void HPresolve::scaleMIP(HighsPostsolveStack& postsolve_stack) {
  for (HighsInt i = 0; i < model->num_row_; ++i) {
    if (rowDeleted[i] || rowsize[i] < 1 ||
        rowsizeInteger[i] + rowsizeImplInt[i] == rowsize[i])
      continue;

    storeRow(i);

    double maxAbsVal = 0.0;

    for (size_t j = 0; j < rowpositions.size(); ++j) {
      HighsInt nzPos = rowpositions[j];
      if (model->integrality_[Acol[nzPos]] != HighsVarType::kContinuous)
        continue;

      maxAbsVal = std::max(std::abs(Avalue[nzPos]), maxAbsVal);
    }

    assert(maxAbsVal != 0.0);

    double scale = std::exp2(std::round(-std::log2(maxAbsVal)));
    if (scale == 1.0) continue;

    if (model->row_upper_[i] == kHighsInf) scale = -scale;

    scaleStoredRow(i, scale);
  }

  for (HighsInt i = 0; i < model->num_col_; ++i) {
    if (colDeleted[i] || colsize[i] < 1 ||
        model->integrality_[i] != HighsVarType::kContinuous)
      continue;

    double maxAbsVal = 0;

    for (const HighsSliceNonzero& nonz : getColumnVector(i)) {
      maxAbsVal = std::max(std::abs(nonz.value()), maxAbsVal);
    }

    double scale = std::exp2(std::round(-std::log2(maxAbsVal)));
    if (scale == 1.0) continue;

    transformColumn(postsolve_stack, i, scale, 0.0);
  }
}